

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_encoding_transform.h
# Opt level: O1

void __thiscall
draco::PredictionSchemeWrapEncodingTransform<int,_int>::Init
          (PredictionSchemeWrapEncodingTransform<int,_int> *this,int *orig_data,int size,
          int num_components)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  (this->super_PredictionSchemeWrapTransformBase<int>).num_components_ = num_components;
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->super_PredictionSchemeWrapTransformBase<int>).clamped_value_,
             (long)num_components);
  if (size != 0) {
    iVar5 = *orig_data;
    iVar3 = iVar5;
    if (1 < size) {
      uVar6 = 1;
      do {
        iVar1 = orig_data[uVar6];
        iVar2 = iVar5;
        if (iVar5 < iVar1) {
          iVar2 = iVar1;
        }
        if (iVar1 < iVar3) {
          iVar2 = iVar5;
          iVar3 = iVar1;
        }
        iVar5 = iVar2;
        uVar6 = uVar6 + 1;
      } while ((uint)size != uVar6);
    }
    (this->super_PredictionSchemeWrapTransformBase<int>).min_value_ = iVar3;
    (this->super_PredictionSchemeWrapTransformBase<int>).max_value_ = iVar5;
    uVar6 = (long)iVar5 - (long)iVar3;
    if (uVar6 < 0x7fffffff) {
      uVar4 = (int)uVar6 + 1;
      (this->super_PredictionSchemeWrapTransformBase<int>).max_dif_ = uVar4;
      uVar4 = uVar4 >> 1;
      (this->super_PredictionSchemeWrapTransformBase<int>).max_correction_ = uVar4;
      (this->super_PredictionSchemeWrapTransformBase<int>).min_correction_ = -uVar4;
      if ((uVar6 & 1) != 0) {
        (this->super_PredictionSchemeWrapTransformBase<int>).max_correction_ = uVar4 - 1;
      }
    }
  }
  return;
}

Assistant:

void Init(const DataTypeT *orig_data, int size, int num_components) {
    PredictionSchemeWrapTransformBase<DataTypeT>::Init(num_components);
    // Go over the original values and compute the bounds.
    if (size == 0) {
      return;
    }
    DataTypeT min_value = orig_data[0];
    DataTypeT max_value = min_value;
    for (int i = 1; i < size; ++i) {
      if (orig_data[i] < min_value) {
        min_value = orig_data[i];
      } else if (orig_data[i] > max_value) {
        max_value = orig_data[i];
      }
    }
    this->set_min_value(min_value);
    this->set_max_value(max_value);
    this->InitCorrectionBounds();
  }